

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# param.c
# Opt level: O3

int arg_analyze(int argc,char **argv)

{
  char cVar1;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  int iVar5;
  
  g_param.msq_key = 0x7045;
  g_param.output_lv = OUTPUT_LV_INFO;
  g_param.speed = 0;
  g_param.option = OPTION_HIGH_PREC;
  g_param.ssm_id = 0;
  builtin_strncpy(g_param.parameter_filename,"./robot.param",0xe);
  builtin_strncpy(g_param.device_name,"/dev/ttyUSB0",0xd);
  if (1 < argc) {
    iVar5 = 1;
    do {
      pcVar2 = argv[iVar5];
      iVar3 = strcmp(pcVar2,"--help");
      if ((iVar3 == 0) ||
         (((cVar1 = *pcVar2, cVar1 == '-' && (pcVar2[1] == 'h')) && (pcVar2[2] == '\0')))) {
        g_param._272_8_ = g_param._272_8_ | 0x800000000;
      }
      else {
        iVar3 = strcmp(pcVar2,"--long-help");
        if (iVar3 == 0) {
          g_param._272_8_ = g_param._272_8_ | 0x1000000000;
        }
        else {
          iVar3 = strcmp(pcVar2,"--daemon");
          if (iVar3 == 0) {
            g_param._272_8_ = g_param._272_8_ | 0x8000000000;
          }
          else {
            iVar3 = strcmp(pcVar2,"--ping");
            if (iVar3 == 0) {
              g_param._272_8_ = g_param._272_8_ | 0x10000000000000;
            }
            else {
              iVar3 = strcmp(pcVar2,"--param-help");
              if (iVar3 == 0) {
                g_param._272_8_ = g_param._272_8_ | 0x2000000000;
              }
              else {
                iVar3 = strcmp(pcVar2,"--show-odometry");
                if (iVar3 != 0) {
                  if (cVar1 != '-') {
                    iVar3 = strcmp(pcVar2,"--show-timestamp");
                    if (iVar3 == 0) goto LAB_0010c04a;
                    iVar3 = strcmp(pcVar2,"--param");
                    if (iVar3 == 0) goto LAB_0010c089;
LAB_0010bfb4:
                    iVar3 = strcmp(pcVar2,"--socket");
                    if (iVar3 == 0) {
                      iVar5 = iVar5 + 1;
                      if (argc <= iVar5) goto LAB_0010c474;
                      g_param.port = atoi(argv[iVar5]);
                      g_param._272_8_ = g_param._272_8_ | 0x20000000000;
                    }
                    else {
                      iVar3 = strcmp(pcVar2,"--admask");
                      if (iVar3 == 0) {
                        iVar5 = iVar5 + 1;
                        if (argc <= iVar5) goto LAB_0010c474;
                        g_param.admask = '\0';
                        if (*argv[iVar5] != '\0') {
                          g_param.admask = 0;
                          pcVar2 = argv[iVar5];
                          do {
                            pcVar4 = pcVar2 + 1;
                            g_param.admask = g_param.admask * '\x02';
                            if (*pcVar2 == '1') {
                              g_param.admask = g_param.admask | 1;
                            }
                            pcVar2 = pcVar4;
                          } while (*pcVar4 != '\0');
                        }
                      }
                      else {
                        iVar3 = strcmp(pcVar2,"--device");
                        if (iVar3 == 0) {
LAB_0010c12b:
                          iVar5 = iVar5 + 1;
                          if (argc <= iVar5) {
LAB_0010c474:
                            pcVar4 = "ERROR :  option requires an argument -- \'%s\'.\n";
LAB_0010c47b:
                            yprintf(OUTPUT_LV_ERROR,pcVar4,pcVar2);
                            return 0;
                          }
                          strcpy(g_param.device_name,argv[iVar5]);
                        }
                        else {
                          if (cVar1 == '-') {
                            if ((pcVar2[1] == 'd') && (pcVar2[2] == '\0')) goto LAB_0010c12b;
                            iVar3 = strcmp(pcVar2,"--without-control");
                            if ((iVar3 != 0) && ((pcVar2[1] != 'c' || (pcVar2[2] != '\0'))))
                            goto LAB_0010c166;
LAB_0010c03e:
                            g_param._272_8_ = g_param._272_8_ | 0x200000000;
                          }
                          else {
                            iVar3 = strcmp(pcVar2,"--without-control");
                            if (iVar3 == 0) goto LAB_0010c03e;
LAB_0010c166:
                            iVar3 = strcmp(pcVar2,"--without-device");
                            if (iVar3 != 0) {
                              iVar3 = strcmp(pcVar2,"--high-resolution");
                              if ((iVar3 == 0) ||
                                 (iVar3 = strcmp(pcVar2,"--high-resolution=yes"), iVar3 == 0)) {
                                g_param._272_8_ = g_param._272_8_ | 0x8000000000000;
                              }
                              else {
                                iVar3 = strcmp(pcVar2,"--high-resolution=no");
                                if (iVar3 == 0) {
                                  g_param._272_8_ = g_param._272_8_ & 0xfff7ffffffffffff;
                                }
                                else {
                                  iVar3 = strcmp(pcVar2,"--version");
                                  if ((iVar3 == 0) ||
                                     (((cVar1 == '-' && (pcVar2[1] == 'v')) && (pcVar2[2] == '\0')))
                                     ) {
                                    g_param._272_8_ = g_param._272_8_ | 0x4000000000;
                                  }
                                  else {
                                    iVar3 = strcmp(pcVar2,"--verbose");
                                    if (iVar3 == 0) {
                                      g_param.output_lv = OUTPUT_LV_DEBUG;
                                    }
                                    else {
                                      iVar3 = strcmp(pcVar2,"--quiet");
                                      if (iVar3 == 0) {
                                        g_param.output_lv = OUTPUT_LV_WARNING;
                                      }
                                      else {
                                        iVar3 = strcmp(pcVar2,"--reconnect");
                                        if (iVar3 == 0) {
                                          g_param._272_8_ = g_param._272_8_ | 0x800000000000;
                                        }
                                        else {
                                          iVar3 = strcmp(pcVar2,"--enable-set-bs");
                                          if (iVar3 == 0) {
                                            g_param._272_8_ = g_param._272_8_ | 0x200000000000;
                                          }
                                          else {
                                            iVar3 = strcmp(pcVar2,"--enable-get-digital-io");
                                            if (iVar3 == 0) {
                                              g_param._272_8_ = g_param._272_8_ | 0x1000000000000;
                                            }
                                            else {
                                              iVar3 = strcmp(pcVar2,"--no-yp-protocol");
                                              if (iVar3 == 0) {
                                                g_param._272_8_ = g_param._272_8_ | 0x400000000000;
                                              }
                                              else {
                                                iVar3 = strcmp(pcVar2,"--without-ssm");
                                                if (iVar3 == 0) {
                                                  g_param._272_8_ = g_param._272_8_ | 0x100000000000
                                                  ;
                                                }
                                                else {
                                                  iVar3 = strcmp(pcVar2,"--msq-key");
                                                  if (iVar3 == 0) {
LAB_0010c393:
                                                    iVar5 = iVar5 + 1;
                                                    if (argc <= iVar5) goto LAB_0010c474;
                                                    g_param.msq_key = atoi(argv[iVar5]);
                                                  }
                                                  else {
                                                    if (cVar1 == '-') {
                                                      if ((pcVar2[1] == 'q') && (pcVar2[2] == '\0'))
                                                      goto LAB_0010c393;
                                                      iVar3 = strcmp(pcVar2,"--speed");
                                                      if ((iVar3 != 0) &&
                                                         ((pcVar2[1] != 's' || (pcVar2[2] != '\0')))
                                                         ) goto LAB_0010c3cd;
                                                    }
                                                    else {
                                                      iVar3 = strcmp(pcVar2,"--speed");
                                                      if (iVar3 != 0) {
LAB_0010c3cd:
                                                        iVar3 = strcmp(pcVar2,"--passive");
                                                        if (iVar3 == 0) {
                                                          g_param._272_8_ =
                                                               g_param._272_8_ | 0x2000000000000;
                                                        }
                                                        else {
                                                          iVar3 = strcmp(pcVar2,"--update-param");
                                                          if (iVar3 == 0) {
                                                            g_param._272_8_ =
                                                                 g_param._272_8_ | 0x4000000000000;
                                                          }
                                                          else {
                                                            iVar3 = strcmp(pcVar2,"--ssm-id");
                                                            if (iVar3 == 0) {
                                                              iVar5 = iVar5 + 1;
                                                              if (argc <= iVar5) goto LAB_0010c474;
                                                              g_param.ssm_id = atoi(argv[iVar5]);
                                                            }
                                                            else {
                                                              iVar3 = strcmp(pcVar2,
                                                  "--exit-on-time-jump");
                                                  if (iVar3 != 0) {
                                                    pcVar4 = "ERROR : invalid option -- \'%s\'.\n";
                                                    goto LAB_0010c47b;
                                                  }
                                                  g_param._272_8_ =
                                                       g_param._272_8_ | 0x20000000000000;
                                                  }
                                                  }
                                                  }
                                                  goto LAB_0010c32b;
                                                  }
                                                  }
                                                  iVar5 = iVar5 + 1;
                                                  if (argc <= iVar5) goto LAB_0010c474;
                                                  iVar3 = atoi(argv[iVar5]);
                                                  g_param.speed = iVar3;
                                                  }
                                                }
                                              }
                                            }
                                          }
                                        }
                                      }
                                    }
                                  }
                                }
                              }
                              goto LAB_0010c32b;
                            }
                            g_param._272_8_ = g_param._272_8_ | 0x480200000000;
                          }
                          g_state[0] = '\0';
                          g_state[1] = '\0';
                          g_state[2] = '\0';
                          g_state[3] = '\0';
                        }
                      }
                    }
                    goto LAB_0010c32b;
                  }
                  if ((pcVar2[1] != 'o') || (pcVar2[2] != '\0')) {
                    iVar3 = strcmp(pcVar2,"--show-timestamp");
                    if (iVar3 == 0) {
LAB_0010c04a:
                      g_param._272_8_ = g_param._272_8_ | 0x400000000;
                    }
                    else {
                      if (pcVar2[1] == 't') {
                        if (pcVar2[2] == '\0') goto LAB_0010c04a;
                        iVar3 = strcmp(pcVar2,"--param");
                      }
                      else {
                        iVar3 = strcmp(pcVar2,"--param");
                      }
                      if ((iVar3 != 0) && ((pcVar2[1] != 'p' || (pcVar2[2] != '\0'))))
                      goto LAB_0010bfb4;
LAB_0010c089:
                      iVar5 = iVar5 + 1;
                      if (argc <= iVar5) goto LAB_0010c474;
                      strcpy(g_param.parameter_filename,argv[iVar5]);
                      g_param._272_8_ = g_param._272_8_ | 0x40000000000;
                    }
                    goto LAB_0010c32b;
                  }
                }
                g_param._272_8_ = g_param._272_8_ | 0x100000000;
              }
            }
          }
        }
      }
LAB_0010c32b:
      iVar5 = iVar5 + 1;
    } while (iVar5 < argc);
  }
  return 1;
}

Assistant:

int arg_analyze(int argc, char* argv[])
{
  int i;

  g_param.option = OPTION_DEFAULT;
  g_param.msq_key = YPSPUR_MSQ_KEY;
  g_param.output_lv = OUTPUT_LV_INFO;
  g_param.speed = 0;
  g_param.ssm_id = 0;

  strcpy(g_param.parameter_filename, DEFAULT_PARAMETER_FILE);
  strcpy(g_param.device_name, DEFAULT_DEVICE_NAME);

  for (i = 1; i < argc; i++)
  {
    if (!strcmp(argv[i], "--help") || !strcmp(argv[i], "-h"))
    {
      g_param.option |= OPTION_SHOW_HELP;
    }
    else if (!strcmp(argv[i], "--long-help"))
    {
      g_param.option |= OPTION_SHOW_LONGHELP;
    }
    else if (!strcmp(argv[i], "--daemon"))
    {
      g_param.option |= OPTION_DAEMON;
    }
    else if (!strcmp(argv[i], "--ping"))
    {
      g_param.option |= OPTION_PING;
    }
    else if (!strcmp(argv[i], "--param-help"))
    {
      g_param.option |= OPTION_SHOW_PARAMHELP;
    }
    else if (!strcmp(argv[i], "--show-odometry") || !strcmp(argv[i], "-o"))
    {
      g_param.option |= OPTION_SHOW_ODOMETRY;
    }
    else if (!strcmp(argv[i], "--show-timestamp") || !strcmp(argv[i], "-t"))
    {
      g_param.option |= OPTION_SHOW_TIMESTAMP;
    }
    else if (!strcmp(argv[i], "--param") || !strcmp(argv[i], "-p"))
    {
      if (i + 1 < argc)
      {
        i++;
        strcpy(g_param.parameter_filename, argv[i]);
        g_param.option |= OPTION_PARAM_FILE;
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--socket"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.port = atoi(argv[i]);
        g_param.option |= OPTION_SOCKET;
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--admask"))
    {
      if (i + 1 < argc)
      {
        char* pos;

        i++;
        g_param.admask = 0;
        for (pos = argv[i]; *pos != 0; pos++)
        {
          g_param.admask = g_param.admask << 1;
          if (*pos == '1')
            g_param.admask |= 1;
        }
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--device") || !strcmp(argv[i], "-d"))
    {
      if (i + 1 < argc)
      {
        i++;
        strcpy(g_param.device_name, argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--without-control") || !strcmp(argv[i], "-c"))
    {
      g_param.option |= OPTION_PARAM_CONTROL;
      disable_state(YP_STATE_MOTOR);
      disable_state(YP_STATE_VELOCITY);
      disable_state(YP_STATE_BODY);
      disable_state(YP_STATE_TRACKING);
    }
    else if (!strcmp(argv[i], "--without-device"))
    {
      g_param.option |= OPTION_WITHOUT_DEVICE;
      g_param.option |= OPTION_DO_NOT_USE_YP;
      g_param.option |= OPTION_PARAM_CONTROL;
      disable_state(YP_STATE_MOTOR);
      disable_state(YP_STATE_VELOCITY);
      disable_state(YP_STATE_BODY);
      disable_state(YP_STATE_TRACKING);
    }
    else if (!strcmp(argv[i], "--high-resolution") ||
             !strcmp(argv[i], "--high-resolution=yes"))
    {
      g_param.option |= OPTION_HIGH_PREC;
    }
    else if (!strcmp(argv[i], "--high-resolution=no"))
    {
      g_param.option &= ~OPTION_HIGH_PREC;
    }
    else if (!strcmp(argv[i], "--version") || !strcmp(argv[i], "-v"))
    {
      g_param.option |= OPTION_VERSION;
    }
    else if (!strcmp(argv[i], "--verbose"))
    {
      g_param.output_lv = OUTPUT_LV_DEBUG;
    }
    else if (!strcmp(argv[i], "--quiet"))
    {
      g_param.output_lv = OUTPUT_LV_WARNING;
    }
    else if (!strcmp(argv[i], "--reconnect"))
    {
      g_param.option |= OPTION_RECONNECT;
    }
    else if (!strcmp(argv[i], "--enable-set-bs"))
    {
      g_param.option |= OPTION_ENABLE_SET_BS;
    }
    else if (!strcmp(argv[i], "--enable-get-digital-io"))
    {
      g_param.option |= OPTION_ENABLE_GET_DIGITAL_IO;
    }
    else if (!strcmp(argv[i], "--no-yp-protocol"))
    {
      g_param.option |= OPTION_DO_NOT_USE_YP;
    }
    else if (!strcmp(argv[i], "--without-ssm"))
    {
      g_param.option |= OPTION_WITHOUT_SSM;
    }
    else if (!strcmp(argv[i], "--msq-key") || !strcmp(argv[i], "-q"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.msq_key = atoi(argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--speed") || !strcmp(argv[i], "-s"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.speed = atoi(argv[i]);
      }
      else
        break;
    }
    else if (!strcmp(argv[i], "--passive"))
    {
      g_param.option |= OPTION_PASSIVE;
    }
    else if (!strcmp(argv[i], "--update-param"))
    {
      g_param.option |= OPTION_UPDATE_PARAM;
    }
    else if (!strcmp(argv[i], "--ssm-id"))
    {
      if (i + 1 < argc)
      {
        i++;
        g_param.ssm_id = atoi(argv[i]);
      }
      else
      {
        break;
      }
    }
    else if (!strcmp(argv[i], "--exit-on-time-jump"))
    {
      g_param.option |= OPTION_EXIT_ON_TIME_JUMP;
    }
    else
    {
      yprintf(OUTPUT_LV_ERROR, "ERROR : invalid option -- '%s'.\n", argv[i]);
      return 0;
    }
  }

  if (i < argc)
  {
    yprintf(OUTPUT_LV_ERROR, "ERROR :  option requires an argument -- '%s'.\n", argv[i]);
    return 0;
  }

  return 1;
}